

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionAccess
          (ExpressionContext *ctx,SynBase *source,FunctionLookupChain chain,ExprBase *context)

{
  TypeFunction *type_00;
  IntrusiveList<FunctionHandle> functions_00;
  bool_type bVar1;
  FunctionData *pFVar2;
  FunctionHandle *pFVar3;
  SynBase *source_00;
  ArrayView<TypeBase_*> setTypes;
  ArrayView<TypeBase*> local_138 [16];
  TypeFunctionSet *local_128;
  TypeFunctionSet *type;
  TypeFunction *local_108;
  TypeFunction *local_100 [3];
  undefined1 auStack_e8 [8];
  IntrusiveList<FunctionHandle> functions;
  SmallArray<TypeBase_*,_16U> types;
  FunctionLookupChain curr;
  ExprBase *context_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  anon_unknown.dwarf_e7629::FunctionLookupChain::next
            ((FunctionLookupChain *)&types.allocator,&chain);
  bVar1 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                    ((FunctionLookupChain *)&types.allocator);
  if (bVar1 == 0) {
    curr.scope = (ScopeData *)context;
    if (context == (ExprBase *)0x0) {
      source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pFVar2 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator*(&chain);
      curr.scope = (ScopeData *)CreateFunctionContextAccess(ctx,source_00,pFVar2);
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprFunctionAccess>(ctx);
    pFVar2 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator->(&chain);
    type_00 = pFVar2->type;
    pFVar2 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator*(&chain);
    ExprFunctionAccess::ExprFunctionAccess
              ((ExprFunctionAccess *)ctx_local,source,&type_00->super_TypeBase,pFVar2,
               (ExprBase *)curr.scope);
  }
  else {
    SmallArray<TypeBase_*,_16U>::SmallArray
              ((SmallArray<TypeBase_*,_16U> *)&functions.tail,ctx->allocator);
    IntrusiveList<FunctionHandle>::IntrusiveList((IntrusiveList<FunctionHandle> *)auStack_e8);
    pFVar2 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator->(&chain);
    local_100[0] = pFVar2->type;
    SmallArray<TypeBase_*,_16U>::push_back
              ((SmallArray<TypeBase_*,_16U> *)&functions.tail,(TypeBase **)local_100);
    pFVar3 = ExpressionContext::get<FunctionHandle>(ctx);
    pFVar2 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator*(&chain);
    FunctionHandle::FunctionHandle(pFVar3,pFVar2);
    IntrusiveList<FunctionHandle>::push_back((IntrusiveList<FunctionHandle> *)auStack_e8,pFVar3);
    while( true ) {
      bVar1 = (anonymous_namespace)::FunctionLookupChain::operator_cast_to_function_pointer
                        ((FunctionLookupChain *)&types.allocator);
      if (bVar1 == 0) break;
      pFVar2 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator->
                         ((FunctionLookupChain *)&types.allocator);
      local_108 = pFVar2->type;
      SmallArray<TypeBase_*,_16U>::push_back
                ((SmallArray<TypeBase_*,_16U> *)&functions.tail,(TypeBase **)&local_108);
      pFVar3 = ExpressionContext::get<FunctionHandle>(ctx);
      pFVar2 = anon_unknown.dwarf_e7629::FunctionLookupChain::operator*
                         ((FunctionLookupChain *)&types.allocator);
      FunctionHandle::FunctionHandle(pFVar3,pFVar2);
      IntrusiveList<FunctionHandle>::push_back((IntrusiveList<FunctionHandle> *)auStack_e8,pFVar3);
      anon_unknown.dwarf_e7629::FunctionLookupChain::next
                ((FunctionLookupChain *)&type,(FunctionLookupChain *)&types.allocator);
    }
    ArrayView<TypeBase*>::ArrayView<16u>(local_138,(SmallArray<TypeBase_*,_16U> *)&functions.tail);
    setTypes._12_4_ = 0;
    setTypes._0_12_ = local_138._0_12_;
    local_128 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprFunctionOverloadSet>(ctx);
    functions_00.tail = functions.head;
    functions_00.head = (FunctionHandle *)auStack_e8;
    ExprFunctionOverloadSet::ExprFunctionOverloadSet
              ((ExprFunctionOverloadSet *)ctx_local,source,&local_128->super_TypeBase,functions_00,
               context);
    SmallArray<TypeBase_*,_16U>::~SmallArray((SmallArray<TypeBase_*,_16U> *)&functions.tail);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateFunctionAccess(ExpressionContext &ctx, SynBase *source, FunctionLookupChain chain, ExprBase *context)
{
	if(FunctionLookupChain curr = chain.next())
	{
		SmallArray<TypeBase*, 16> types(ctx.allocator);
		IntrusiveList<FunctionHandle> functions;

		types.push_back(chain->type);
		functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(*chain));

		while(curr)
		{
			types.push_back(curr->type);
			functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(*curr));

			curr = curr.next();
		}

		TypeFunctionSet *type = ctx.GetFunctionSetType(types);

		return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, context);
	}

	if(!context)
		context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), *chain);

	return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, chain->type, *chain, context);
}